

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_trie.hpp
# Opt level: O0

void __thiscall
poplar::
compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::show_stats(compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
             *this,ostream *os,int n)

{
  uint32_t uVar1;
  uint64_t uVar2;
  undefined4 in_EDX;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *in_RSI;
  compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *in_RDI;
  undefined1 auVar3 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [16];
  undefined1 in_ZMM1 [64];
  standard_hash_table<80U,_poplar::hash::vigna_hasher> *unaff_retaddr;
  string indent;
  char (*in_stack_ffffffffffffff48) [18];
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *indent_00;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  string *in_stack_ffffffffffffff58;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *indent_01;
  ostream *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff78;
  ostream *in_stack_ffffffffffffffb8;
  split_mix_hasher *in_stack_ffffffffffffffc0;
  string local_38 [28];
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this_00;
  int iVar5;
  compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *os_00;
  
  auVar4 = in_ZMM1._0_16_;
  auVar3 = in_ZMM0._0_16_;
  os_00 = in_RDI;
  get_indent_abi_cxx11_((int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  show_stat<char[18]>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                      (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      in_stack_ffffffffffffff48);
  uVar2 = size(in_RDI);
  auVar3 = vcvtusi2sd_avx512f(auVar3,uVar2);
  uVar2 = capa_size((compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                     *)0x1e1643);
  auVar4 = vcvtusi2sd_avx512f(auVar4,uVar2);
  iVar5 = (int)((ulong)((auVar3._0_8_ / auVar4._0_8_) * 100.0) >> 0x20);
  show_stat<double>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                    (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                    (double *)in_stack_ffffffffffffff48);
  show_stat<unsigned_int>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
             (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (uint *)in_stack_ffffffffffffff48);
  size(in_RDI);
  show_stat<unsigned_long>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
             (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (unsigned_long *)in_stack_ffffffffffffff48);
  indent_01 = in_RSI;
  alloc_bytes((compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
               *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  show_stat<unsigned_long>
            ((ostream *)in_RSI,in_stack_ffffffffffffff58,
             (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (unsigned_long *)in_stack_ffffffffffffff48);
  indent_00 = indent_01;
  capa_bits((compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
             *)0x1e173f);
  show_stat<unsigned_int>
            ((ostream *)in_RSI,(string *)indent_01,
             (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (uint *)in_stack_ffffffffffffff48);
  this_00 = indent_00;
  uVar1 = symb_bits((compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                     *)0x1e1779);
  show_stat<unsigned_int>
            ((ostream *)in_RSI,(string *)indent_01,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff50)
             ,(uint *)indent_00);
  show_stat<unsigned_int>
            ((ostream *)in_RSI,(string *)indent_01,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff50)
             ,(uint *)indent_00);
  show_stat<unsigned_int>
            ((ostream *)in_RSI,(string *)indent_01,(char *)CONCAT44(uVar1,in_stack_ffffffffffffff50)
             ,(uint *)indent_00);
  show_member((ostream *)CONCAT44(uVar1,in_stack_ffffffffffffff50),(string *)indent_00,
              (char *)0x1e180c);
  bijective_hash::split_mix_hasher::show_stats
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,iVar5);
  show_member((ostream *)CONCAT44(uVar1,in_stack_ffffffffffffff50),(string *)indent_00,
              (char *)0x1e1847);
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::show_stats
            (this_00,(ostream *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4
            );
  iVar5 = (int)((ulong)this_00 >> 0x20);
  show_member((ostream *)CONCAT44(uVar1,in_stack_ffffffffffffff50),(string *)indent_00,
              (char *)0x1e1886);
  standard_hash_table<80U,_poplar::hash::vigna_hasher>::show_stats
            (unaff_retaddr,(ostream *)os_00,iVar5);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void show_stats(std::ostream& os, int n = 0) const {
        auto indent = get_indent(n);
        show_stat(os, indent, "name", "compact_hash_trie");
        show_stat(os, indent, "factor", double(size()) / capa_size() * 100);
        show_stat(os, indent, "max_factor", MaxFactor);
        show_stat(os, indent, "size", size());
        show_stat(os, indent, "alloc_bytes", alloc_bytes());
        show_stat(os, indent, "capa_bits", capa_bits());
        show_stat(os, indent, "symb_bits", symb_bits());
        show_stat(os, indent, "dsp1st_bits", dsp1_bits);
        show_stat(os, indent, "dsp2nd_bits", dsp2_bits);
#ifdef POPLAR_EXTRA_STATS
        show_stat(os, indent, "rate_dsp1st", double(num_dsps_[0]) / size());
        show_stat(os, indent, "rate_dsp2nd", double(num_dsps_[1]) / size());
        show_stat(os, indent, "rate_dsp3rd", double(num_dsps_[2]) / size());
        show_stat(os, indent, "num_resize", num_resize_);
#endif
        show_member(os, indent, "hasher_");
        hasher_.show_stats(os, n + 1);
        show_member(os, indent, "aux_cht_");
        aux_cht_.show_stats(os, n + 1);
        show_member(os, indent, "aux_map_");
        aux_map_.show_stats(os, n + 1);
    }